

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O0

int __thiscall
DTSStreamReader::getTSDescriptor
          (DTSStreamReader *this,uint8_t *dstBuff,bool blurayMode,bool hdmvDescriptors)

{
  int iVar1;
  uint value;
  uint8_t *puVar2;
  uint8_t *end;
  undefined1 local_60 [8];
  BitStreamWriter bitWriter;
  int local_38;
  int len;
  int skipBeforeBytes;
  int skipBytes;
  uint8_t *frame;
  bool hdmvDescriptors_local;
  uint8_t *puStack_20;
  bool blurayMode_local;
  uint8_t *dstBuff_local;
  DTSStreamReader *this_local;
  
  frame._6_1_ = hdmvDescriptors;
  frame._7_1_ = blurayMode;
  puStack_20 = dstBuff;
  dstBuff_local = (uint8_t *)this;
  _skipBeforeBytes =
       findFrame(this,(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_buffer,
                 (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd);
  if (_skipBeforeBytes == (uint8_t *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    len = 0;
    local_38 = 0;
    bitWriter.m_bitWrited =
         decodeFrame(this,_skipBeforeBytes,
                     (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd,&len,
                     &local_38);
    if ((int)bitWriter.m_bitWrited < 1) {
      this_local._4_4_ = 0;
    }
    else {
      this->m_state = stDecodeDTS;
      if ((frame._6_1_ & 1) == 0) {
        builtin_memcpy(puStack_20,"\x05\x04DTS",5);
        puVar2 = puStack_20 + 5;
        iVar1 = this->pi_frame_length;
        if (iVar1 == 0x200) {
          *puVar2 = '1';
        }
        else if (iVar1 == 0x400) {
          *puVar2 = '2';
        }
        else if (iVar1 == 0x800) {
          *puVar2 = '3';
        }
        else {
          *puVar2 = ' ';
        }
        puStack_20 = puStack_20 + 6;
        BitStreamWriter::BitStreamWriter((BitStreamWriter *)local_60);
        *puStack_20 = 's';
        puVar2 = puStack_20 + 2;
        puStack_20[1] = '\x05';
        end = puStack_20 + 7;
        puStack_20 = puVar2;
        BitStreamWriter::setBuffer((BitStreamWriter *)local_60,puVar2,end);
        BitStreamWriter::putBits((BitStreamWriter *)local_60,4,this->pi_sample_rate_index);
        BitStreamWriter::putBits((BitStreamWriter *)local_60,6,this->pi_bit_rate_index);
        BitStreamWriter::putBits((BitStreamWriter *)local_60,7,this->nblks);
        BitStreamWriter::putBits((BitStreamWriter *)local_60,0xe,bitWriter.m_bitWrited);
        value = getSurroundModeCode(this);
        BitStreamWriter::putBits((BitStreamWriter *)local_60,6,value);
        BitStreamWriter::putBits
                  ((BitStreamWriter *)local_60,1,(uint)((this->pi_channels_conf & 0x1000U) != 0));
        BitStreamWriter::putBits((BitStreamWriter *)local_60,2,(uint)(this->m_dtsEsChannels != 0));
        BitStreamWriter::flushBits((BitStreamWriter *)local_60);
        this_local._4_4_ = 0xd;
      }
      else {
        this_local._4_4_ = 0;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int DTSStreamReader::getTSDescriptor(uint8_t* dstBuff, bool blurayMode, const bool hdmvDescriptors)
{
    uint8_t* frame = findFrame(m_buffer, m_bufEnd);
    if (frame == nullptr)
        return 0;
    int skipBytes = 0;
    int skipBeforeBytes = 0;
    const int len = decodeFrame(frame, m_bufEnd, skipBytes, skipBeforeBytes);
    if (len < 1)
        return 0;

    m_state = DTSDecodeState::stDecodeDTS;

    // no DTS descriptor in Blu-ray
    if (hdmvDescriptors)
        return 0;

    // ETSI TS 101 154 F.4.2 DTS registration descriptor
    *dstBuff++ = static_cast<int>(TSDescriptorTag::REGISTRATION);  // descriptor tag
    *dstBuff++ = 4;                                                // descriptor length
    *dstBuff++ = 'D';
    *dstBuff++ = 'T';
    *dstBuff++ = 'S';

    switch (pi_frame_length)
    {
    case 512:
        *dstBuff++ = '1';
        break;
    case 1024:
        *dstBuff++ = '2';
        break;
    case 2048:
        *dstBuff++ = '3';
        break;
    default:
        *dstBuff++ = ' ';
    }

    // ETSI TS 101 154 F.4.3 DTS audio descriptor
    BitStreamWriter bitWriter{};

    *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::DTS);  // descriptor tag;
    *dstBuff++ = 5;                                           // descriptor length
    bitWriter.setBuffer(dstBuff, dstBuff + 5);
    bitWriter.putBits(4, pi_sample_rate_index);
    bitWriter.putBits(6, pi_bit_rate_index);
    bitWriter.putBits(7, nblks);
    bitWriter.putBits(14, len);
    bitWriter.putBits(6, getSurroundModeCode());
    bitWriter.putBits(1, (pi_channels_conf & AOUT_CHAN_LFE) ? 1 : 0);
    bitWriter.putBits(2, m_dtsEsChannels ? 1 : 0);  // DTS-EX flag
    bitWriter.flushBits();

    return 13;  // descriptor length
}